

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

ConvertMnemonicToSeedRequest * __thiscall
cfd::js::api::json::ConvertMnemonicToSeedRequest::GetLanguageString_abi_cxx11_
          (ConvertMnemonicToSeedRequest *this,ConvertMnemonicToSeedRequest *obj)

{
  ConvertMnemonicToSeedRequest *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->language_);
  return this;
}

Assistant:

static std::string GetLanguageString(  // line separate
      const ConvertMnemonicToSeedRequest& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.language_);
  }